

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_reduce.cpp
# Opt level: O1

void duckdb::LambdaFunctions::ListReduceFunction
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  byte bVar1;
  undefined8 uVar2;
  _Head_base<0UL,_duckdb::Vector_*,_false> __ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  ClientContext *context;
  vector *pvVar4;
  TemplatedValidityData<unsigned_long> *pTVar5;
  pointer pVVar6;
  SelectionVector *pSVar7;
  reference pvVar8;
  reference pvVar9;
  pointer pEVar10;
  tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> tVar11;
  type pVVar12;
  Value *pVVar13;
  vector<duckdb::Vector,_true> *pvVar14;
  Value *pVVar15;
  ulong uVar16;
  long lVar17;
  sel_t sVar18;
  size_type __n;
  idx_t idx_in_entry;
  Value *pVVar19;
  ulong uVar20;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  idx_t reduced_row_idx;
  bool completed;
  SelectionVector right_sel;
  vector<duckdb::Vector,_true> slices;
  Vector index_vector;
  LambdaInfo info;
  Vector right_slice;
  DataChunk input_chunk;
  DataChunk even_result_chunk;
  DataChunk odd_result_chunk;
  pointer local_368;
  bool local_359;
  vector<duckdb::Vector,_true> *local_358;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> local_350;
  ulong local_348;
  Value *local_340;
  undefined1 local_338 [32];
  _Head_base<0UL,_duckdb::Vector_*,_false> local_318;
  _Head_base<0UL,_duckdb::ExpressionExecutor_*,_false> local_310;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_308;
  idx_t local_2f0;
  sel_t *local_2e8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  SelectionVector local_2d0;
  SelectionVector local_2b8;
  vector<duckdb::Vector,_std::allocator<duckdb::Vector>_> local_298;
  undefined1 local_278 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_270;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_218;
  unsigned_long *local_210;
  undefined1 local_208 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  optional_ptr<duckdb::Vector,_true> local_1b8;
  Vector *local_1b0;
  vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
  local_1a0;
  optional_ptr<duckdb::Expression,_true> local_188;
  Value *local_180;
  bool local_178;
  bool local_177;
  bool local_176;
  bool local_175;
  idx_t local_170;
  LogicalType local_168 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_138;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  vector<duckdb::Vector,_true> local_108;
  pointer local_f0;
  LogicalType local_c8 [24];
  vector<duckdb::Vector,_true> local_b0 [2];
  vector<duckdb::Vector,_true> local_70 [2];
  
  local_359 = false;
  LambdaInfo::LambdaInfo((LambdaInfo *)local_208,args,state,result,&local_359);
  if (local_359 == false) {
    context = (ClientContext *)duckdb::ExpressionState::GetContext();
    ReduceExecuteInfo::ReduceExecuteInfo
              ((ReduceExecuteInfo *)local_338,(LambdaInfo *)local_208,context);
    duckdb::DataChunk::DataChunk((DataChunk *)local_70);
    pvVar4 = (vector *)duckdb::Allocator::DefaultAllocator();
    optional_ptr<duckdb::Expression,_true>::CheckValid(&local_188);
    duckdb::LogicalType::LogicalType
              ((LogicalType *)&local_170,(LogicalType *)(local_188.ptr + 0x38));
    __l._M_len = 1;
    __l._M_array = (iterator)&local_170;
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278,__l,
               (allocator_type *)&local_108);
    duckdb::DataChunk::Initialize((Allocator *)local_70,pvVar4,(ulong)local_278);
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278);
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_170);
    duckdb::DataChunk::DataChunk((DataChunk *)local_b0);
    pvVar4 = (vector *)duckdb::Allocator::DefaultAllocator();
    optional_ptr<duckdb::Expression,_true>::CheckValid(&local_188);
    duckdb::LogicalType::LogicalType
              ((LogicalType *)&local_170,(LogicalType *)(local_188.ptr + 0x38));
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_170;
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278,__l_00
               ,(allocator_type *)&local_108);
    duckdb::DataChunk::Initialize((Allocator *)local_b0,pvVar4,(ulong)local_278);
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_278);
    duckdb::LogicalType::~LogicalType((LogicalType *)&local_170);
    uVar16 = 0;
    do {
      local_358 = local_70;
      if ((uVar16 & 1) == 0) {
        local_358 = local_b0;
      }
      local_368 = (pointer)0x0;
      uVar20 = local_2f0 + uVar16;
      local_210 = (unsigned_long *)local_338._0_8_;
      local_2b8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8.sel_vector = (sel_t *)0x0;
      local_2b8.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      SelectionVector::Initialize(&local_2b8,(idx_t)local_180);
      local_348 = uVar16;
      if (local_180 != (Value *)0x0) {
        pVVar15 = (Value *)0x0;
        pVVar19 = (Value *)0x0;
        sVar18 = 0;
        lVar17 = 0;
        do {
          local_340 = pVVar15;
          if (local_210[lVar17] == 0) {
            pVVar19 = pVVar19 + 0x40;
          }
          else if ((Value *)(lVar17 << 6) < local_180) {
            do {
              if (((unsigned_long *)local_338._0_8_ == (unsigned_long *)0x0) ||
                 ((*(ulong *)(local_338._0_8_ + ((ulong)pVVar19 >> 6) * 8) >>
                   ((ulong)pVVar19 & 0x3f) & 1) != 0)) {
                pVVar13 = pVVar19;
                if (*(long *)local_208._8_8_ != 0) {
                  pVVar13 = (Value *)(ulong)*(uint *)(*(long *)local_208._8_8_ + (long)pVVar19 * 4);
                }
                if (uVar20 < ((list_entry_t *)(local_208._0_8_ + pVVar13 * 0x10))->length) {
                  local_2b8.sel_vector[(long)local_368] =
                       (int)((list_entry_t *)(local_208._0_8_ + pVVar13 * 0x10))->offset +
                       (int)uVar20;
                  local_2e8[0][(long)local_368] = sVar18;
                  local_2d0.sel_vector[(long)local_368] = (sel_t)pVVar19;
                  local_368 = local_368 + 1;
                }
                else {
                  if ((uVar20 == 0 & local_177 &
                      ((list_entry_t *)(local_208._0_8_ + pVVar13 * 0x10))->length == 0) == 1) {
                    if ((unsigned_long *)local_338._0_8_ == (unsigned_long *)0x0) {
                      local_170 = local_338._24_8_;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_278,&local_170);
                      p_Var3 = p_Stack_270;
                      local_338._8_8_ = local_278;
                      uVar2 = local_338._16_8_;
                      local_278 = (undefined1  [8])0x0;
                      p_Stack_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_338._16_8_ = p_Var3;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                      }
                      if (p_Stack_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_270);
                      }
                      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                               operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                           *)(local_338 + 8));
                      local_338._0_8_ =
                           (pTVar5->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar1 = (byte)pVVar19 & 0x3f;
                    *(ulong *)(local_338._0_8_ + ((ulong)pVVar19 >> 6) * 8) =
                         *(ulong *)(local_338._0_8_ + ((ulong)pVVar19 >> 6) * 8) &
                         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
                    vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                              ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,0);
                    duckdb::Vector::GetValue((ulong)local_278);
                    duckdb::Vector::SetValue((ulong)local_1b0,pVVar19);
                  }
                  else {
                    if ((unsigned_long *)local_338._0_8_ == (unsigned_long *)0x0) {
                      local_170 = local_338._24_8_;
                      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                                ((duckdb *)local_278,&local_170);
                      p_Var3 = p_Stack_270;
                      local_338._8_8_ = local_278;
                      uVar2 = local_338._16_8_;
                      local_278 = (undefined1  [8])0x0;
                      p_Stack_270 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                      local_338._16_8_ = p_Var3;
                      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
                          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
                      }
                      if (p_Stack_270 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_270);
                      }
                      pTVar5 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::
                               operator->((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                           *)(local_338 + 8));
                      local_338._0_8_ =
                           (pTVar5->owned_data).
                           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                           .super__Head_base<0UL,_unsigned_long_*,_false>;
                    }
                    bVar1 = (byte)pVVar19 & 0x3f;
                    *(ulong *)(local_338._0_8_ + ((ulong)pVVar19 >> 6) * 8) =
                         *(ulong *)(local_338._0_8_ + ((ulong)pVVar19 >> 6) * 8) &
                         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
                    unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                    operator->((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                                *)&local_318);
                    duckdb::Vector::GetValue((ulong)local_278);
                    duckdb::Vector::SetValue((ulong)local_1b0,pVVar19);
                  }
                  duckdb::Value::~Value((Value *)local_278);
                }
                sVar18 = sVar18 + 1;
              }
              pVVar19 = pVVar19 + 1;
              pVVar15 = pVVar15 + 1;
            } while (pVVar15 < local_180);
          }
          lVar17 = lVar17 + 1;
          pVVar15 = local_340 + 0x40;
        } while (pVVar19 < local_180);
      }
      local_340 = (Value *)local_368;
      if (local_368 != (pointer)0x0) {
        duckdb::Value::BIGINT((long)&local_170);
        duckdb::Vector::Vector((Vector *)local_278,(Value *)&local_170);
        duckdb::Value::~Value((Value *)&local_170);
        pVVar6 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                           ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *
                            )&local_318);
        pSVar7 = (SelectionVector *)
                 unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                           ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *
                            )&local_318);
        duckdb::Vector::Slice(pVVar6,pSVar7,(ulong)local_2e8);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        duckdb::Vector::Vector((Vector *)&local_170,local_1b8.ptr,&local_2b8,(ulong)local_368);
        duckdb::DataChunk::DataChunk((DataChunk *)&local_108);
        duckdb::DataChunk::InitializeEmpty((DataChunk *)&local_108);
        local_f0 = local_368;
        uVar16 = (ulong)local_178;
        if (uVar16 == 1) {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,0);
          duckdb::Vector::Reference(pvVar8);
        }
        if ((local_348 == 0) && (local_177 == true)) {
          pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                             ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,0);
          duckdb::Vector::Slice((SelectionVector *)(pvVar9->vector)._M_data,(ulong)&local_2d0);
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,uVar16 + 1);
          vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                    ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,0);
        }
        else {
          pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,uVar16 + 1);
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                    ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                     &local_318);
        }
        duckdb::Vector::Reference(pvVar8);
        pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,uVar16);
        duckdb::Vector::Reference(pvVar8);
        local_298.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar20 = (ulong)local_177;
        if (((long)local_1a0.
                   super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1a0.
                   super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 - uVar20 !=
            0) {
          __n = 0;
          do {
            pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                               ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,__n)
            ;
            if (*(pvVar9->vector)._M_data == (Vector)0x2) {
              pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,(uVar16 | 2) + __n);
              vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                        ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,
                         uVar20 + __n);
            }
            else {
              pvVar9 = vector<duckdb::LambdaFunctions::ColumnInfo,_true>::operator[]
                                 ((vector<duckdb::LambdaFunctions::ColumnInfo,_true> *)&local_1a0,
                                  uVar20 + __n);
              std::vector<duckdb::Vector,std::allocator<duckdb::Vector>>::
              emplace_back<std::reference_wrapper<duckdb::Vector>&,duckdb::SelectionVector&,unsigned_long&>
                        ((vector<duckdb::Vector,std::allocator<duckdb::Vector>> *)&local_298,
                         &pvVar9->vector,&local_2d0,(unsigned_long *)&local_368);
              pvVar8 = vector<duckdb::Vector,_true>::operator[](&local_108,(uVar16 | 2) + __n);
              vector<duckdb::Vector,_true>::back((vector<duckdb::Vector,_true> *)&local_298);
            }
            duckdb::Vector::Reference(pvVar8);
            __n = __n + 1;
          } while (__n < ((long)local_1a0.
                                super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_1a0.
                                super__Vector_base<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5
                         - uVar20);
        }
        duckdb::DataChunk::Reset();
        pvVar14 = local_70;
        if ((local_348 & 1) == 0) {
          pvVar14 = local_b0;
        }
        pvVar14[1].super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_start = local_368;
        pEVar10 = unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                  ::operator->((unique_ptr<duckdb::ExpressionExecutor,_std::default_delete<duckdb::ExpressionExecutor>,_true>
                                *)&local_310);
        duckdb::ExpressionExecutor::Execute((DataChunk *)pEVar10,(DataChunk *)&local_108);
        pvVar8 = vector<duckdb::Vector,_true>::operator[](local_358,0);
        tVar11.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             operator_new(0x68);
        duckdb::LogicalType::LogicalType(local_c8,(LogicalType *)(pvVar8 + 8));
        duckdb::Vector::Vector
                  ((Vector *)
                   tVar11.
                   super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
                   super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,local_c8,local_368);
        local_350._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             tVar11.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        duckdb::LogicalType::~LogicalType(local_c8);
        __ptr._M_head_impl = local_318._M_head_impl;
        local_318._M_head_impl =
             (Vector *)
             local_350._M_t.
             super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
             super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
        local_350._M_t.
        super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
        super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
             (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)
             (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)0x0;
        if ((_Head_base<0UL,_duckdb::Vector_*,_false>)__ptr._M_head_impl !=
            (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0) {
          std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_318,__ptr._M_head_impl);
        }
        if (local_350._M_t.
            super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
            super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl !=
            (_Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)0x0) {
          std::default_delete<duckdb::Vector>::operator()
                    ((default_delete<duckdb::Vector> *)&local_350,
                     (Vector *)
                     local_350._M_t.
                     super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
                     super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
        }
        pvVar8 = vector<duckdb::Vector,_true>::operator[](local_358,0);
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)&local_318);
        duckdb::VectorOperations::Copy(pvVar8,pVVar12,(ulong)local_368,0,0);
        std::vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>::~vector(&local_298);
        duckdb::DataChunk::~DataChunk((DataChunk *)&local_108);
        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
        }
        if (local_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_120);
        }
        if (local_138 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138);
        }
        duckdb::LogicalType::~LogicalType(local_168);
        if (local_218 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_218);
        }
        if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
        }
        if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
        }
        duckdb::LogicalType::~LogicalType((LogicalType *)&p_Stack_270);
      }
      if (local_2b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      uVar16 = local_348;
      duckdb::DataChunk::Reset();
      uVar16 = uVar16 + 1;
    } while (local_340 != (Value *)0x0);
    if ((local_175 == true) && (local_176 == false)) {
      duckdb::Vector::SetVectorType((VectorType)local_1b0);
    }
    duckdb::DataChunk::~DataChunk((DataChunk *)local_b0);
    duckdb::DataChunk::~DataChunk((DataChunk *)local_70);
    if (local_2d0.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2d0.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
    }
    std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_308);
    if ((_Tuple_impl<0UL,_duckdb::ExpressionExecutor_*,_std::default_delete<duckdb::ExpressionExecutor>_>
         )local_310._M_head_impl != (ExpressionExecutor *)0x0) {
      std::default_delete<duckdb::ExpressionExecutor>::operator()
                ((default_delete<duckdb::ExpressionExecutor> *)&local_310,local_310._M_head_impl);
    }
    local_310._M_head_impl = (ExpressionExecutor *)0x0;
    if (local_318._M_head_impl != (Vector *)0x0) {
      std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_318,local_318._M_head_impl);
    }
    local_318._M_head_impl = (Vector *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_338._16_8_);
    }
  }
  std::
  vector<duckdb::LambdaFunctions::ColumnInfo,_std::allocator<duckdb::LambdaFunctions::ColumnInfo>_>
  ::~vector(&local_1a0);
  if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
  }
  if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
  }
  return;
}

Assistant:

void LambdaFunctions::ListReduceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	// Initializes the left slice from the list entries, active rows, the expression executor and the input types
	bool completed = false;
	LambdaInfo info(args, state, result, completed);
	if (completed) {
		return;
	}

	ReduceExecuteInfo execute_info(info, state.GetContext());

	// Since the left slice references the result chunk, we need to create two result chunks.
	// This means there is always an empty result chunk for the next iteration,
	// without the referenced chunk having to be reset until the current iteration is complete.
	DataChunk odd_result_chunk;
	odd_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	DataChunk even_result_chunk;
	even_result_chunk.Initialize(Allocator::DefaultAllocator(), {info.lambda_expr->return_type});

	// Execute reduce until all rows are finished.
	idx_t loops = 0;
	bool end = false;
	while (!end) {
		auto &result_chunk = loops % 2 ? odd_result_chunk : even_result_chunk;
		auto &spare_result_chunk = loops % 2 ? even_result_chunk : odd_result_chunk;

		end = ExecuteReduce(loops, execute_info, info, result_chunk);
		spare_result_chunk.Reset();
		loops++;
	}

	if (info.is_all_constant && !info.is_volatile) {
		info.result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}